

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O1

int mbedtls_cipher_write_tag(mbedtls_cipher_context_t *ctx,uchar *tag,size_t tag_len)

{
  mbedtls_cipher_info_t *pmVar1;
  int iVar2;
  
  pmVar1 = ctx->cipher_info;
  iVar2 = -0x6100;
  if ((pmVar1 != (mbedtls_cipher_info_t *)0x0) && (ctx->operation == MBEDTLS_ENCRYPT)) {
    if (pmVar1->mode == MBEDTLS_MODE_GCM) {
      iVar2 = mbedtls_gcm_finish((mbedtls_gcm_context *)ctx->cipher_ctx,tag,tag_len);
      return iVar2;
    }
    iVar2 = 0;
    if ((pmVar1->type == MBEDTLS_CIPHER_CHACHA20_POLY1305) && (iVar2 = -0x6100, tag_len == 0x10)) {
      iVar2 = mbedtls_chachapoly_finish((mbedtls_chachapoly_context *)ctx->cipher_ctx,tag);
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_cipher_write_tag( mbedtls_cipher_context_t *ctx,
                      unsigned char *tag, size_t tag_len )
{
    CIPHER_VALIDATE_RET( ctx != NULL );
    CIPHER_VALIDATE_RET( tag_len == 0 || tag != NULL );
    if( ctx->cipher_info == NULL )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    if( MBEDTLS_ENCRYPT != ctx->operation )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

#if defined(MBEDTLS_USE_PSA_CRYPTO)
    if( ctx->psa_enabled == 1 )
    {
        /* While PSA Crypto has an API for multipart
         * operations, we currently don't make it
         * accessible through the cipher layer. */
        return( MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE );
    }
#endif /* MBEDTLS_USE_PSA_CRYPTO */

#if defined(MBEDTLS_GCM_C)
    if( MBEDTLS_MODE_GCM == ctx->cipher_info->mode )
        return( mbedtls_gcm_finish( (mbedtls_gcm_context *) ctx->cipher_ctx,
                                    tag, tag_len ) );
#endif

#if defined(MBEDTLS_CHACHAPOLY_C)
    if ( MBEDTLS_CIPHER_CHACHA20_POLY1305 == ctx->cipher_info->type )
    {
        /* Don't allow truncated MAC for Poly1305 */
        if ( tag_len != 16U )
            return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

        return( mbedtls_chachapoly_finish(
                    (mbedtls_chachapoly_context*) ctx->cipher_ctx, tag ) );
    }
#endif

    return( 0 );
}